

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

lzma_match *
hc_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  lzma_match *plVar1;
  uint uVar2;
  ulong uVar3;
  uint8_t *puVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  bool bVar8;
  
  son[cyclic_pos] = cur_match;
  do {
    do {
      do {
        bVar8 = depth == 0;
        depth = depth - 1;
        if (bVar8) {
          return matches;
        }
        uVar2 = pos - cur_match;
        if (cyclic_size <= uVar2) {
          return matches;
        }
        puVar4 = cur + -(ulong)uVar2;
        uVar5 = 0;
        if (cyclic_pos < uVar2) {
          uVar5 = cyclic_size;
        }
        cur_match = son[(cyclic_pos - uVar2) + uVar5];
      } while ((puVar4[len_best] != cur[len_best]) || (*puVar4 != *cur));
      uVar5 = 0;
      uVar7 = 1;
      do {
        if (uVar7 - (len_limit - 1) == 1) {
          uVar5 = len_limit;
          uVar6 = (uint32_t)uVar7;
          break;
        }
        uVar3 = uVar7 & 0xffffffff;
        uVar7 = uVar7 + 1;
        uVar5 = uVar5 + 1;
        uVar6 = uVar5;
      } while (puVar4[uVar3] == cur[uVar3]);
    } while (uVar5 <= len_best);
    plVar1 = matches + 1;
    matches->len = uVar5;
    matches->dist = uVar2 - 1;
    matches = plVar1;
    len_best = uVar5;
    if (uVar6 == len_limit) {
      return plVar1;
    }
  } while( true );
}

Assistant:

static lzma_match *
hc_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	son[cyclic_pos] = cur_match;

	while (true) {
		const uint32_t delta = pos - cur_match;
		const uint8_t *pb;
		if (depth-- == 0 || delta >= cyclic_size)
			return matches;

		pb = cur - delta;
		cur_match = son[cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0)];

		if (pb[len_best] == cur[len_best] && pb[0] == cur[0]) {
			uint32_t len = 0;
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit)
					return matches;
			}
		}
	}
}